

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov1detection.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov1Detection::forward_inplace(Yolov1Detection *this,Mat *bottom_top_blob,Option *opt)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  void *pvVar9;
  int _h;
  int iVar10;
  int *piVar11;
  float *pfVar12;
  int j;
  long lVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar22;
  undefined1 auVar21 [16];
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> detected_objects;
  ObjectsManager objects;
  Mat local_70;
  
  _h = this->side * this->side;
  iVar5 = this->box_num;
  if (bottom_top_blob->w < (iVar5 * 5 + this->classes) * _h) {
    iVar5 = -1;
  }
  else {
    if (this->softmax_enable != 0) {
      objects.object_boxs_table.
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)bottom_top_blob->data;
      objects.object_boxs_table.
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bottom_top_blob->elemsize;
      objects.prob_steps._0_4_ = bottom_top_blob->elempack;
      objects.step = (size_t)bottom_top_blob->allocator;
      objects.object_boxs_table.
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      Mat::reshape(&local_70,(Mat *)&objects,this->classes,_h,(Allocator *)0x0);
      Mat::~Mat(&local_70);
      (*this->softmax->_vptr_Layer[9])(this->softmax,&objects,opt);
      Mat::~Mat((Mat *)&objects);
      iVar5 = this->box_num;
    }
    ObjectsManager::ObjectsManager(&objects,(long)((iVar5 * _h) / 0x14));
    pvVar9 = bottom_top_blob->data;
    iVar5 = this->classes;
    iVar10 = this->box_num;
    pfVar8 = (float *)((long)pvVar9 + (long)(iVar5 * _h) * 4);
    pfVar12 = pfVar8 + iVar10 * _h;
    for (iVar7 = 0; iVar7 != _h; iVar7 = iVar7 + 1) {
      iVar2 = this->side;
      for (iVar6 = 0; iVar6 < iVar10; iVar6 = iVar6 + 1) {
        uVar4 = (uint)(this->sqrt_enable == 0);
        uVar1 = *(ulong *)(pfVar12 + 2);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = uVar1;
        auVar21._0_8_ = CONCAT44((int)(uVar4 << 0x1f) >> 0x1f,(int)(uVar4 << 0x1f) >> 0x1f);
        auVar21._8_8_ = 0;
        fVar20 = SUB164(~auVar21 & auVar19,0) * (float)uVar1 + (float)(auVar21._0_8_ & uVar1);
        fVar22 = SUB164(~auVar21 & auVar19,4) * (float)(uVar1 >> 0x20) +
                 (float)((auVar21._0_8_ & uVar1) >> 0x20);
        fVar18 = 1.0 / (float)this->side;
        fVar15 = fVar20 * -0.5 + fVar18 * ((float)*(undefined8 *)pfVar12 + (float)(iVar7 % iVar2));
        fVar17 = fVar22 * -0.5 +
                 fVar18 * ((float)((ulong)*(undefined8 *)pfVar12 >> 0x20) + (float)(iVar7 / iVar2));
        pfVar12 = pfVar12 + 4;
        fVar18 = *pfVar8;
        pfVar8 = pfVar8 + 1;
        for (lVar13 = 0; lVar13 < iVar5; lVar13 = lVar13 + 1) {
          fVar16 = *(float *)((long)pvVar9 + lVar13 * 4) * fVar18;
          if (this->confidence_threshold <= fVar16 && fVar16 != this->confidence_threshold) {
            detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(fVar17,fVar15);
            detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pointer)CONCAT44(fVar22 + fVar17,fVar20 + fVar15);
            detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)CONCAT44((int)lVar13,fVar16);
            ObjectsManager::add_new_object_box(&objects,(ObjectBox *)&detected_objects);
            iVar5 = this->classes;
          }
        }
        iVar10 = this->box_num;
      }
      pvVar9 = (void *)((long)pvVar9 + (long)iVar5 * 4);
    }
    detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ObjectsManager::do_objects_nms
              (&objects,&detected_objects,this->nms_threshold,this->confidence_threshold);
    Mat::create(bottom_top_blob,6,
                (int)(((long)detected_objects.
                             super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)detected_objects.
                            super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x18),4,opt->blob_allocator)
    ;
    iVar5 = -100;
    if ((bottom_top_blob->data != (void *)0x0) &&
       ((long)bottom_top_blob->c * bottom_top_blob->cstep != 0)) {
      lVar13 = ((long)detected_objects.
                      super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)detected_objects.
                     super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18;
      iVar5 = bottom_top_blob->w;
      sVar3 = bottom_top_blob->elemsize;
      pfVar8 = (float *)((long)bottom_top_blob->data + 0x14);
      piVar11 = &(detected_objects.
                  super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                  super__Vector_impl_data._M_start)->classid;
      while (bVar14 = lVar13 != 0, lVar13 = lVar13 + -1, bVar14) {
        pfVar8[-5] = (float)(*piVar11 + 1);
        pfVar8[-4] = (float)piVar11[-1];
        pfVar8[-3] = ((ObjectBox *)(piVar11 + -5))->xmin;
        pfVar8[-2] = (float)piVar11[-4];
        pfVar8[-1] = (float)piVar11[-3];
        *pfVar8 = (float)piVar11[-2];
        pfVar8 = (float *)((long)pfVar8 + (long)iVar5 * sVar3);
        piVar11 = piVar11 + 6;
      }
      iVar5 = 0;
    }
    std::_Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::~_Vector_base
              (&detected_objects.
                super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>);
    ObjectsManager::~ObjectsManager(&objects);
  }
  return iVar5;
}

Assistant:

int Yolov1Detection::forward_inplace(Mat &bottom_top_blob, const Option &opt) const
{
    int size = side * side;
    int map_total = size * (box_num * 5 + classes);
    if (bottom_top_blob.w < map_total)
        return -1;

    if (softmax_enable)
    {
        Mat classes_scores = bottom_top_blob.range(0, size * classes);
        classes_scores.reshape(classes, size);
        softmax->forward_inplace(classes_scores, opt);
    }

    ObjectsManager objects(size * box_num / 20);
    const float *classes_ptr = bottom_top_blob;
    const float *scales_ptr = classes_ptr + size * classes;
    const float *boxes_ptr = scales_ptr + size * box_num;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < size; i++)
    {
        int x_offset = i % side;
        int y_offset = i / side;

        for (int n = 0; n < box_num; n++)
        {

            float w = (sqrt_enable == 0) * boxes_ptr[2] + (sqrt_enable != 0) * boxes_ptr[2] * boxes_ptr[2];
            float h = (sqrt_enable == 0) * boxes_ptr[3] + (sqrt_enable != 0) * boxes_ptr[3] * boxes_ptr[3];
            float xmin = (boxes_ptr[0] + x_offset) / side - w * 0.5f;
            float ymin = (boxes_ptr[1] + y_offset) / side - h * 0.5f;
            float xmax = xmin + w;
            float ymax = ymin + h;
            boxes_ptr += 4;

            float scale = scales_ptr[0];
            scales_ptr++;

            for (int j = 0; j < classes; j++)
            {
                float prob = scale * classes_ptr[j];
                if (prob > confidence_threshold)
                {
                    ObjectBox object = {
                        .xmin = xmin,
                        .ymin = ymin,
                        .xmax = xmax,
                        .ymax = ymax,
                        .prob = prob,
                        .classid = j,
                    };
                    objects.add_new_object_box(object);
                }
            }
        }

        classes_ptr += classes;
    }

    std::vector<ObjectBox> detected_objects;
    objects.do_objects_nms(detected_objects, nms_threshold, confidence_threshold);

    bottom_top_blob.create(6, (int)detected_objects.size(), 4u, opt.blob_allocator);
    if (bottom_top_blob.empty())
        return -100;

    for (int i = 0; i < detected_objects.size(); i++)
    {
        const ObjectBox &r = detected_objects[i];
        float *outptr = bottom_top_blob.row(i);

        outptr[0] = r.classid + 1; // 0 reserve for background
        outptr[1] = r.prob;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}